

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

bool Js::JavascriptNumber::TryGetInt32OrUInt32Value(double value,int32 *int32Value,bool *isInt32)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  bool bVar5;
  double dVar6;
  
  if (int32Value == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x72,"(int32Value)","int32Value");
    if (!bVar2) goto LAB_00b8a30f;
    *puVar4 = 0;
  }
  if (isInt32 == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x73,"(isInt32)","isInt32");
    if (!bVar2) {
LAB_00b8a30f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (value <= 0.0) {
    bVar5 = TryGetInt32Value<false>(value,int32Value);
    bVar2 = bVar5;
  }
  else {
    iVar3 = (int)(long)value;
    dVar6 = (double)((long)value & 0xffffffff);
    if ((dVar6 != value) || (NAN(dVar6) || NAN(value))) {
      return false;
    }
    *int32Value = iVar3;
    bVar5 = -1 < iVar3;
    bVar2 = true;
  }
  *isInt32 = bVar5;
  return bVar2;
}

Assistant:

bool JavascriptNumber::TryGetInt32OrUInt32Value(const double value, int32 *const int32Value, bool *const isInt32)
    {
        Assert(int32Value);
        Assert(isInt32);

        if(value <= 0)
        {
            return *isInt32 = TryGetInt32Value(value, int32Value);
        }

        const uint32 i = static_cast<uint32>(value);
        if(static_cast<double>(i) != value)
        {
            return false;
        }

        *int32Value = i;
        *isInt32 = static_cast<int32>(i) >= 0;
        return true;
    }